

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O1

void __thiscall
absl::Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Flag
          (Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,char *name,char *type,char *help,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *default_value)

{
  element_type **ppeVar1;
  Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pFVar2;
  pointer pcVar3;
  element_type *peVar4;
  FlagFunc *__p;
  long *plVar5;
  undefined8 *puVar6;
  Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pFVar7;
  _func_int **pp_Var8;
  undefined1 local_d0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  element_type *local_98;
  undefined8 uStack_90;
  shared_ptr<absl::internal::FlagFunc> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  undefined2 *local_70;
  undefined8 local_68;
  undefined2 local_60;
  undefined6 uStack_5e;
  undefined2 *local_50;
  undefined8 local_48;
  undefined2 local_40;
  undefined6 uStack_3e;
  
  this->_vptr_Flag = (_func_int **)&PTR__Flag_00381590;
  local_78 = &this->value_;
  local_b0 = &(this->value_).field_2;
  (this->value_)._M_dataplus._M_p = (pointer)local_b0;
  pcVar3 = (default_value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,pcVar3,pcVar3 + default_value->_M_string_length);
  __p = (FlagFunc *)operator_new(0x58);
  (__p->default_value)._M_dataplus._M_p = (pointer)&(__p->default_value).field_2;
  (__p->default_value)._M_string_length = 0;
  (__p->default_value).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)&(__p->set_value).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(__p->set_value).super__Function_base._M_functor + 8) = 0;
  (__p->set_value).super__Function_base._M_manager = (_Manager_type)0x0;
  (__p->set_value)._M_invoker = (_Invoker_type)0x0;
  (this->func_).super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<absl::internal::FlagFunc*>
            (&(this->func_).super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,__p);
  peVar4 = (this->func_).super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar4->name = name;
  peVar4->help = help;
  peVar4->type = type;
  local_60 = 0x22;
  local_68 = 1;
  local_70 = &local_60;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_70,(ulong)(default_value->_M_dataplus)._M_p);
  pFVar2 = (Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
           )(local_d0 + 0x10);
  pFVar7 = (Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
           )(plVar5 + 2);
  if ((Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
      *plVar5 == pFVar7) {
    local_d0._16_8_ = pFVar7->_vptr_Flag;
    local_d0._24_8_ = plVar5[3];
    local_d0._0_8_ = pFVar2;
  }
  else {
    local_d0._16_8_ = pFVar7->_vptr_Flag;
    local_d0._0_8_ =
         (Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
         *plVar5;
  }
  local_d0._8_8_ = plVar5[1];
  *plVar5 = (long)pFVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_40 = 0x22;
  local_48 = 1;
  pp_Var8 = (_func_int **)0xf;
  if ((Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
      local_d0._0_8_ != pFVar2) {
    pp_Var8 = (_func_int **)local_d0._16_8_;
  }
  local_50 = &local_40;
  if (((_func_int **)(local_d0._8_8_ + 1) < (_func_int **)0x10) &&
     (pp_Var8 < (_func_int **)(local_d0._8_8_ + 1))) {
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,local_d0._0_8_);
  }
  else {
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append(local_d0,(ulong)&local_40);
  }
  local_a8._M_allocated_capacity = (size_type)&local_98;
  ppeVar1 = (element_type **)(puVar6 + 2);
  if ((element_type **)*puVar6 == ppeVar1) {
    local_98 = *ppeVar1;
    uStack_90 = puVar6[3];
  }
  else {
    local_98 = *ppeVar1;
    local_a8._M_allocated_capacity = (size_type)(element_type **)*puVar6;
  }
  local_a8._8_8_ = puVar6[1];
  *puVar6 = ppeVar1;
  puVar6[1] = 0;
  *(undefined1 *)ppeVar1 = 0;
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT62(uStack_3e,local_40) + 1);
  }
  if ((Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
      local_d0._0_8_ != pFVar2) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT62(uStack_5e,local_60) + 1);
  }
  std::__cxx11::string::operator=
            ((string *)
             &((this->func_).
               super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              default_value,(string *)local_a8._M_local_buf);
  if ((element_type **)local_a8._M_allocated_capacity != &local_98) {
    operator_delete((void *)local_a8._M_allocated_capacity,(ulong)((long)&local_98->name + 1));
  }
  local_d0._0_8_ = this;
  std::function<void(std::__cxx11::string_const&)>::operator=
            ((function<void(std::__cxx11::string_const&)> *)
             &((this->func_).
               super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              set_value,(anon_class_8_1_8991fb9c *)local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d0,name,(allocator<char> *)&local_70);
  local_88.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->func_).super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_88.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (this->func_).super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_88.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_88.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (local_88.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_88.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (local_88.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  internal::RegisterFlag((string *)local_d0,&local_88);
  if (local_88.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
      local_d0._0_8_ != pFVar2) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  return;
}

Assistant:

Flag<T>::Flag(const char *name, const char *type, const char *help,
              const T &default_value)
    : value_(default_value), func_(new internal::FlagFunc) {
  func_->name = name;
  func_->help = help;
  func_->type = type;
  func_->default_value = internal::to_str<T>(default_value);
  func_->set_value = [this](const std::string &value) {
    this->set_value_as_str(value);
  };
  RegisterFlag(name, func_);
}